

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O2

bool __thiscall QProcessPrivate::openChannels(QProcessPrivate *this)

{
  bool bVar1;
  long in_FS_OFFSET;
  QMessageLogger local_30;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->inputChannelMode == '\x01') {
    if ((this->stdinChannel).type != Normal) {
      local_30.context.version = 2;
      local_30.context.function._4_4_ = 0;
      local_30.context._4_8_ = 0;
      local_30.context._12_8_ = 0;
      local_30.context.category = "default";
      QMessageLogger::warning
                (&local_30,"QProcess::openChannels: Inconsistent stdin channel configuration");
    }
LAB_003cc36e:
    if ((this->processChannelMode & 0xfe) == 2) {
      if ((this->stdoutChannel).type != Normal) {
        local_30.context.version = 2;
        local_30.context.function._4_4_ = 0;
        local_30.context._4_8_ = 0;
        local_30.context._12_8_ = 0;
        local_30.context.category = "default";
        QMessageLogger::warning
                  (&local_30,"QProcess::openChannels: Inconsistent stdout channel configuration");
      }
    }
    else {
      bVar1 = openChannel(this,&this->stdoutChannel);
      if (!bVar1) goto LAB_003cc3fb;
    }
    if (this->processChannelMode < 5) {
      if ((0x16U >> (this->processChannelMode & 0x1f) & 1) == 0) goto LAB_003cc3e8;
      if ((this->stderrChannel).type != Normal) {
        local_30.context.version = 2;
        local_30.context.function._4_4_ = 0;
        local_30.context._4_8_ = 0;
        local_30.context._12_8_ = 0;
        local_30.context.category = "default";
        QMessageLogger::warning
                  (&local_30,"QProcess::openChannels: Inconsistent stderr channel configuration");
      }
    }
    else {
LAB_003cc3e8:
      bVar1 = openChannel(this,&this->stderrChannel);
      if (!bVar1) goto LAB_003cc3fb;
    }
    bVar1 = true;
  }
  else {
    bVar1 = openChannel(this,&this->stdinChannel);
    if (bVar1) goto LAB_003cc36e;
LAB_003cc3fb:
    bVar1 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QProcessPrivate::openChannels()
{
    // stdin channel.
    if (inputChannelMode == QProcess::ForwardedInputChannel) {
        if (stdinChannel.type != Channel::Normal)
            qWarning("QProcess::openChannels: Inconsistent stdin channel configuration");
    } else if (!openChannel(stdinChannel)) {
        return false;
    }

    // stdout channel.
    if (processChannelMode == QProcess::ForwardedChannels
            || processChannelMode == QProcess::ForwardedOutputChannel) {
        if (stdoutChannel.type != Channel::Normal)
            qWarning("QProcess::openChannels: Inconsistent stdout channel configuration");
    } else if (!openChannel(stdoutChannel)) {
        return false;
    }

    // stderr channel.
    if (processChannelMode == QProcess::ForwardedChannels
            || processChannelMode == QProcess::ForwardedErrorChannel
            || processChannelMode == QProcess::MergedChannels) {
        if (stderrChannel.type != Channel::Normal)
            qWarning("QProcess::openChannels: Inconsistent stderr channel configuration");
    } else if (!openChannel(stderrChannel)) {
        return false;
    }

    return true;
}